

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::ProcessStatsConfig::Serialize(ProcessStatsConfig *this,Message *msg)

{
  ProcessStatsConfig_Quirks *pPVar1;
  uint8_t *src_begin;
  ulong uVar2;
  ProcessStatsConfig_Quirks *it;
  ProcessStatsConfig_Quirks *pPVar3;
  
  pPVar1 = (this->quirks_).
           super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (this->quirks_).
                super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::ProcessStatsConfig_Quirks>
              (msg,1,*pPVar3);
  }
  uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar2 & 4) != 0) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)this->scan_all_processes_on_start_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 8) != 0) {
    protozero::Message::AppendTinyVarInt(msg,3,(uint)this->record_thread_names_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x10) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,4,this->proc_stats_poll_ms_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x40) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->proc_stats_cache_ttl_ms_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void ProcessStatsConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: quirks
  for (auto& it : quirks_) {
    msg->AppendVarInt(1, it);
  }

  // Field 2: scan_all_processes_on_start
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, scan_all_processes_on_start_);
  }

  // Field 3: record_thread_names
  if (_has_field_[3]) {
    msg->AppendTinyVarInt(3, record_thread_names_);
  }

  // Field 4: proc_stats_poll_ms
  if (_has_field_[4]) {
    msg->AppendVarInt(4, proc_stats_poll_ms_);
  }

  // Field 6: proc_stats_cache_ttl_ms
  if (_has_field_[6]) {
    msg->AppendVarInt(6, proc_stats_cache_ttl_ms_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}